

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# halfEdgeMesh.cpp
# Opt level: O0

void __thiscall
CMU462::Vertex::getNeighborhood
          (Vertex *this,
          map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
          *seen,int depth)

{
  bool bVar1;
  pointer pHVar2;
  VertexIter *pVVar3;
  pointer this_00;
  double *pdVar4;
  pointer ppVar5;
  HalfedgeIter *pHVar6;
  int in_EDX;
  Vertex *in_RSI;
  long in_RDI;
  VertexIter u_1;
  iterator d;
  VertexIter u;
  double dist;
  HalfedgeIter h;
  map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
  *in_stack_ffffffffffffff48;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  undefined1 uVar7;
  Vector3D *in_stack_ffffffffffffff58;
  Vertex *this_01;
  _Self local_70;
  _Self local_68 [4];
  double local_48;
  _Self local_40;
  _Self local_38;
  _List_node_base *local_30;
  double local_28;
  int depth_00;
  _Self _Var8;
  undefined4 in_stack_ffffffffffffffe8;
  
  if (-1 < in_EDX) {
    local_28 = std::numeric_limits<double>::infinity();
    do {
      this_01 = in_RSI;
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      Halfedge::twin(pHVar2);
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      pVVar3 = Halfedge::vertex(pHVar2);
      local_30 = pVVar3->_M_node;
      in_RSI = this_01;
      this_00 = std::_List_iterator<CMU462::Vertex>::operator->
                          ((_List_iterator<CMU462::Vertex> *)
                           CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      halfedge(this_00);
      local_38._M_node =
           (_Base_ptr)
           std::
           map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
           ::find(in_stack_ffffffffffffff48,(key_type *)0x2312ab);
      local_40._M_node =
           (_Base_ptr)
           std::
           map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
           ::end(in_stack_ffffffffffffff48);
      bVar1 = std::operator!=(&local_38,&local_40);
      if (bVar1) {
        ppVar5 = std::
                 _Rb_tree_iterator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>
                 ::operator->((_Rb_tree_iterator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>
                               *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
        in_stack_ffffffffffffff58 = (Vector3D *)ppVar5->second;
        std::_List_iterator<CMU462::Vertex>::operator->
                  ((_List_iterator<CMU462::Vertex> *)
                   CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
        Vector3D::operator-(in_stack_ffffffffffffff58,
                            (Vector3D *)
                            CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
        local_48 = Vector3D::norm((Vector3D *)0x231326);
        local_48 = (double)in_stack_ffffffffffffff58 + local_48;
        pdVar4 = std::min<double>(&local_48,&local_28);
        local_28 = *pdVar4;
      }
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      Halfedge::twin(pHVar2);
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
      Halfedge::next(pHVar2);
      bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,(_Self *)(in_RDI + 0xe8));
    } while (bVar1);
    local_68[0]._M_node =
         (_Base_ptr)
         std::
         map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
         ::find(in_stack_ffffffffffffff48,(key_type *)0x2313be);
    local_70._M_node =
         (_Base_ptr)
         std::
         map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
         ::end(in_stack_ffffffffffffff48);
    bVar1 = std::operator==(local_68,&local_70);
    uVar7 = true;
    if (!bVar1) {
      std::
      map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
      ::find(in_stack_ffffffffffffff48,(key_type *)0x231406);
      ppVar5 = std::
               _Rb_tree_iterator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>::
               operator->((_Rb_tree_iterator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>
                           *)CONCAT17(uVar7,in_stack_ffffffffffffff50));
      uVar7 = local_28 < ppVar5->second;
    }
    if ((bool)uVar7 != false) {
      std::
      map<std::_List_iterator<CMU462::Halfedge>,double,std::less<std::_List_iterator<CMU462::Halfedge>>,std::allocator<std::pair<std::_List_iterator<CMU462::Halfedge>const,double>>>
      ::emplace<std::_List_iterator<CMU462::Halfedge>&,double&>
                ((map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
                  *)this_01,(_List_iterator<CMU462::Halfedge> *)in_stack_ffffffffffffff58,
                 (double *)CONCAT17(uVar7,in_stack_ffffffffffffff50));
    }
    _Var8._M_node = *(_List_node_base **)(in_RDI + 0xe8);
    do {
      depth_00 = (int)((ulong)_Var8._M_node >> 0x20);
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(uVar7,in_stack_ffffffffffffff50));
      Halfedge::twin(pHVar2);
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(uVar7,in_stack_ffffffffffffff50));
      Halfedge::vertex(pHVar2);
      std::_List_iterator<CMU462::Vertex>::operator->
                ((_List_iterator<CMU462::Vertex> *)CONCAT17(uVar7,in_stack_ffffffffffffff50));
      getNeighborhood(in_RSI,(map<std::_List_iterator<CMU462::Halfedge>,_double,_std::less<std::_List_iterator<CMU462::Halfedge>_>,_std::allocator<std::pair<const_std::_List_iterator<CMU462::Halfedge>,_double>_>_>
                              *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),depth_00);
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(uVar7,in_stack_ffffffffffffff50));
      Halfedge::twin(pHVar2);
      pHVar2 = std::_List_iterator<CMU462::Halfedge>::operator->
                         ((_List_iterator<CMU462::Halfedge> *)
                          CONCAT17(uVar7,in_stack_ffffffffffffff50));
      pHVar6 = Halfedge::next(pHVar2);
      _Var8._M_node = pHVar6->_M_node;
      bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,(_Self *)(in_RDI + 0xe8));
    } while (bVar1);
  }
  return;
}

Assistant:

void Vertex::getNeighborhood(map<HalfedgeIter, double>& seen, int depth) {
  if (depth < 0) return;

  HalfedgeIter h = _halfedge;
  double dist = INF_D;
  do {
    VertexIter u = h->twin()->vertex();
    auto d = seen.find(u->halfedge());
    if (d != seen.end()) {
      dist = std::min(d->second + (u->position - position).norm(), dist);
    }
    h = h->twin()->next();
  } while (h != _halfedge);

  if (seen.find(h) == seen.end() || seen.find(h)->second > dist) {
    seen.emplace(h, dist);
  }

  h = _halfedge;
  do {
    VertexIter u = h->twin()->vertex();
    u->getNeighborhood(seen, depth - 1);
    h = h->twin()->next();
  } while (h != _halfedge);
}